

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<kj::Array<unsigned_char>_>::clear(ArrayBuilder<kj::Array<unsigned_char>_> *this)

{
  Array<unsigned_char> *this_00;
  
  while (this->ptr < this->pos) {
    this_00 = this->pos + -1;
    this->pos = this_00;
    Array<unsigned_char>::~Array(this_00);
  }
  return;
}

Assistant:

void clear() {
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(ptr);
    } else {
      while (pos > ptr) {
        kj::dtor(*--pos);
      }
    }
  }